

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_highbd_dr_prediction_z2_c
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy,int bd)

{
  byte bVar1;
  ulong uVar2;
  int shift;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ushort *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int c;
  ulong uVar11;
  ulong uVar12;
  
  bVar1 = (byte)upsample_above;
  uVar12 = 0;
  uVar2 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar2 = uVar12;
  }
  if (bh < 1) {
    bh = 0;
  }
  iVar9 = -dx;
  for (uVar4 = 0; uVar4 != bh; uVar4 = uVar4 + 1) {
    uVar3 = (~uVar4 * dx << (bVar1 & 0x1f)) >> 1 & 0x1f;
    iVar10 = iVar9;
    iVar8 = -dy;
    for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
      iVar5 = iVar10 >> (6 - bVar1 & 0x1f);
      if (iVar5 < -1 << (bVar1 & 0x1f)) {
        uVar6 = (uint)(iVar8 << ((byte)upsample_left & 0x1f)) >> 1 & 0x1f;
        puVar7 = left + ((int)uVar12 + iVar8 >> (6 - (byte)upsample_left & 0x1f));
        iVar5 = (0x20 - uVar6) * (uint)*puVar7;
      }
      else {
        puVar7 = above + iVar5;
        iVar5 = (uint)*puVar7 * (0x20 - uVar3);
        uVar6 = uVar3;
      }
      dst[uVar11] = (uint16_t)(iVar5 + puVar7[1] * uVar6 + 0x10 >> 5);
      iVar8 = iVar8 - dy;
      iVar10 = iVar10 + 0x40;
    }
    uVar12 = (ulong)((int)uVar12 + 0x40);
    iVar9 = iVar9 - dx;
    dst = dst + stride;
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z2_c(uint16_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint16_t *above,
                                   const uint16_t *left, int upsample_above,
                                   int upsample_left, int dx, int dy, int bd) {
  (void)bd;
  assert(dx > 0);
  assert(dy > 0);

  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  (void)min_base_y;
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  for (int r = 0; r < bh; ++r) {
    for (int c = 0; c < bw; ++c) {
      int val;
      int y = r + 1;
      int x = (c << 6) - y * dx;
      const int base_x = x >> frac_bits_x;
      if (base_x >= min_base_x) {
        const int shift = ((x * (1 << upsample_above)) & 0x3F) >> 1;
        val = above[base_x] * (32 - shift) + above[base_x + 1] * shift;
        val = ROUND_POWER_OF_TWO(val, 5);
      } else {
        x = c + 1;
        y = (r << 6) - x * dy;
        const int base_y = y >> frac_bits_y;
        assert(base_y >= min_base_y);
        const int shift = ((y * (1 << upsample_left)) & 0x3F) >> 1;
        val = left[base_y] * (32 - shift) + left[base_y + 1] * shift;
        val = ROUND_POWER_OF_TWO(val, 5);
      }
      dst[c] = val;
    }
    dst += stride;
  }
}